

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeInteger.c
# Opt level: O0

asn_enc_rval_t *
NativeInteger_encode_der
          (asn_TYPE_descriptor_t *sd,void *ptr,int tag_mode,ber_tlv_tag_t tag,
          asn_app_consume_bytes_f *cb,void *app_key)

{
  asn_app_consume_bytes_f *cb_00;
  undefined4 in_ECX;
  asn_TYPE_descriptor_t *in_RDX;
  asn_enc_rval_t *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  void *unaff_retaddr;
  uint8_t *p;
  uint8_t buf [8];
  INTEGER_t tmp;
  unsigned_long native;
  ssize_t local_60;
  asn_TYPE_descriptor_s *local_58;
  void *local_50;
  undefined1 *local_48;
  undefined1 local_40 [8];
  undefined1 *local_38;
  undefined4 local_30;
  
  cb_00 = (asn_app_consume_bytes_f *)in_RDX->name;
  for (local_48 = local_40 + 7; local_40 <= local_48; local_48 = local_48 + -1) {
    *local_48 = (char)cb_00;
    cb_00 = (asn_app_consume_bytes_f *)((ulong)cb_00 >> 8);
  }
  local_38 = local_40;
  local_30 = 8;
  INTEGER_encode_der(in_RDX,(void *)CONCAT44(in_ECX,in_R8D),(int)((ulong)in_R9 >> 0x20),
                     (ber_tlv_tag_t)in_R9,cb_00,unaff_retaddr);
  in_RDI->encoded = local_60;
  in_RDI->failed_type = local_58;
  in_RDI->structure_ptr = local_50;
  if (in_RDI->encoded == -1) {
    in_RDI->structure_ptr = in_RDX;
  }
  return in_RDI;
}

Assistant:

asn_enc_rval_t
NativeInteger_encode_der(asn_TYPE_descriptor_t *sd, void *ptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	unsigned long native = *(unsigned long *)ptr;	/* Disable sign ext. */
	asn_enc_rval_t erval;
	INTEGER_t tmp;

#ifdef	WORDS_BIGENDIAN		/* Opportunistic optimization */

	tmp.buf = (uint8_t *)&native;
	tmp.size = sizeof(native);

#else	/* Works even if WORDS_BIGENDIAN is not set where should've been */
	uint8_t buf[sizeof(native)];
	uint8_t *p;

	/* Prepare a fake INTEGER */
	for(p = buf + sizeof(buf) - 1; p >= buf; p--, native >>= 8)
		*p = (uint8_t)native;

	tmp.buf = buf;
	tmp.size = sizeof(buf);
#endif	/* WORDS_BIGENDIAN */
	
	/* Encode fake INTEGER */
	erval = INTEGER_encode_der(sd, &tmp, tag_mode, tag, cb, app_key);
	if(erval.encoded == -1) {
		assert(erval.structure_ptr == &tmp);
		erval.structure_ptr = ptr;
	}
	return erval;
}